

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed-animatable.cc
# Opt level: O2

bool tinyusdz::tydra::EvaluateTypedAnimatableAttribute<tinyusdz::value::quath>
               (Stage *stage,TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_> *tattr,
               string *attr_name,quath *value_out,string *err,double t,
               TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  quath *pqVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  ostringstream ss_e;
  TerminalAttributeValue value_1;
  allocator local_5b9;
  string *local_5b8;
  double local_5b0;
  string local_5a8;
  allocator local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  undefined1 local_528 [32];
  Variability VStack_508;
  undefined1 auStack_504 [60];
  bool local_4c8;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_4a0;
  AttrMetas local_488;
  TerminalAttributeValue local_280;
  
  if (value_out == (quath *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    poVar4 = ::std::operator<<((ostream *)local_528,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed-animatable.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"EvaluateTypedAnimatableAttribute");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd4);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_528,"`value_out` param is nullptr.");
    ::std::operator<<(poVar4,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
  }
  else if (tattr[0x260] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>)0x1) {
joined_r0x003f01a3:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)tinterp;
    local_5b8 = attr_name;
    local_5b0 = t;
    if (tattr[0x228] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>)0x1) {
      VStack_508 = Varying;
      auStack_504._0_5_ = 0;
      local_528._16_8_ = (pointer)0x0;
      local_528[0x18] = '\0';
      local_528._25_7_ = 0;
      local_528._0_2_ = 0;
      local_528._2_2_ = 0;
      local_528._4_2_ = 0;
      local_528._6_2_ = 0;
      local_528[8] = false;
      local_528[9] = false;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out;
      bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>::get_value
                        (tattr,(Animatable<tinyusdz::value::quath> *)local_528);
      if (bVar1) {
        bVar2 = Animatable<tinyusdz::value::quath>::get
                          ((Animatable<tinyusdz::value::quath> *)local_528,local_5b0,value_out,
                           tinterp);
        tattr = (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_> *)0x1;
        if (!bVar2) {
          if (err != (string *)0x0) {
            ::std::__cxx11::string::string
                      ((string *)&local_5a8,"Failed to get TypedAnimatableAttribute value: {} \n",
                       local_588);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_280,(fmt *)&local_5a8,(string *)local_5b8,args);
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          tattr = (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_> *)0x0;
        }
      }
      bVar3 = (byte)tattr;
      ::std::
      _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::quath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::quath>::Sample>_>
      ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::quath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::quath>::Sample>_>
                       *)(local_528 + 0x10));
      if (bVar1) goto LAB_003f004b;
    }
    else {
      if (*(long *)(tattr + 0x218) != *(long *)(tattr + 0x210)) {
        Attribute::Attribute((Attribute *)local_528);
        if (tattr[0x260] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>)0x1) {
          local_4c8 = true;
          VStack_508 = Varying;
        }
        else {
          bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>::is_value_empty
                            (tattr);
          if (((bVar1) || (*(long *)(tattr + 0x218) == *(long *)(tattr + 0x210))) ||
             (((byte)tattr[0x228] & 1) != 0)) {
            tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign((string *)(auStack_504 + 4));
            ::std::__cxx11::string::_M_dispose();
            VStack_508 = Varying;
          }
          else {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&local_4a0,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(tattr + 0x210));
          }
        }
        AttrMetas::operator=(&local_488,(AttrMetas *)tattr);
        TerminalAttributeValue::TerminalAttributeValue(&local_280);
        bVar3 = EvaluateAttribute(stage,(Attribute *)local_528,local_5b8,&local_280,err,local_5b0,
                                  tinterp);
        if ((bool)bVar3) {
          pqVar5 = TerminalAttributeValue::as<tinyusdz::value::quath>(&local_280);
          if (pqVar5 == (quath *)0x0) {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::string
                        ((string *)local_588,
                         "Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}"
                         ,&local_5b9);
              TerminalAttributeValue::type_name_abi_cxx11_(&local_548,&local_280);
              tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (&local_5a8,(fmt *)local_588,&local_548,&local_568,local_5b8,args_2);
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            TerminalAttributeValue::~TerminalAttributeValue(&local_280);
            Attribute::~Attribute((Attribute *)local_528);
            goto LAB_003f0048;
          }
          *value_out = *pqVar5;
        }
        TerminalAttributeValue::~TerminalAttributeValue(&local_280);
        Attribute::~Attribute((Attribute *)local_528);
        goto LAB_003f004b;
      }
      bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>::is_value_empty(tattr);
      if (bVar1) goto joined_r0x003f01a3;
      if (err != (string *)0x0) {
        ::std::__cxx11::string::string
                  ((string *)&local_280,"[Internal error] Invalid TypedAttribute? : {} \n",
                   (allocator *)&local_5a8);
        fmt::format<std::__cxx11::string>
                  ((string *)local_528,(fmt *)&local_280,(string *)attr_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out);
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
    }
  }
LAB_003f0048:
  bVar3 = 0;
LAB_003f004b:
  return (bool)(bVar3 & 1);
}

Assistant:

bool EvaluateTypedAnimatableAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<Animatable<T>> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err,
    const double t,
    const value::TimeSampleInterpolationType tinterp) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  // Eval order:
  // - ValueBlocked?
  // - has value?(default value or timesamped value)
  // - has connection?

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.has_value()) {
    Animatable<T> value;
    if (tattr.get_value(&value)) {
      if (value.get(t, value_out, tinterp)) {
        return true;
      } else {
        if (err) {
          (*err) += fmt::format("Failed to get TypedAnimatableAttribute value: {} \n", attr_name);
        }
        return false;
      }
    }
  } else if (tattr.has_connections()) {

    // Follow targetPath
    Attribute attr = ToAttributeConnection(tattr);

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 t, tinterp);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}", value.type_name(), value::TypeTraits<T>::type_name(), attr_name);
    }

  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else {
    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}